

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headergen.c
# Opt level: O0

void seekcol(FILE *f,int src,int dst)

{
  uint local_1c;
  int n;
  int dst_local;
  int src_local;
  FILE *f_local;
  
  if (src < dst) {
    local_1c = dst / 8 - src / 8;
    if (local_1c == 0) {
      local_1c = dst - src;
    }
    else {
      while (local_1c != 0) {
        fprintf((FILE *)f,"\t");
        local_1c = local_1c + -1;
      }
      local_1c = dst & 7;
    }
    while (local_1c != 0) {
      fprintf((FILE *)f," ");
      local_1c = local_1c - 1;
    }
  }
  else {
    fprintf((FILE *)f,"\t");
  }
  return;
}

Assistant:

void seekcol (FILE *f, int src, int dst) {
	if (dst <= src)
		fprintf (f, "\t");
	else {
		int n = dst/8 - src/8;
		if (n) {
			while (n--)
				fprintf (f, "\t");
			n = dst&7;
		} else
			n = dst-src;
		while (n--)
			fprintf (f, " ");
	}
}